

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  cmCPackIFWPackage *pcVar6;
  long *plVar7;
  char *__s;
  size_t sVar8;
  size_type *psVar9;
  long *plVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_f0;
  _Alloc_hider local_d0;
  size_type local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined1 uStack_b8;
  undefined4 uStack_b7;
  undefined2 uStack_b3;
  char cStack_b1;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_c8 = 0;
  local_c0 = '\0';
  local_d0._M_p = &local_c0;
  if (component == (cmCPackComponent *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_b8,uStack_bf);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_b7;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_b3;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_b1;
    __return_storage_ptr__->_M_string_length = 0;
    local_c8 = 0;
    local_c0 = '\0';
    goto LAB_0024eed2;
  }
  pcVar6 = GetComponentPackage(this,component);
  if (pcVar6 != (cmCPackIFWPackage *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
    goto LAB_0024eed2;
  }
  cmsys::SystemTools::UpperCase(&local_90,&component->Name);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x4ed022);
  paVar1 = &local_f0.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_f0.field_2._M_allocated_capacity = *psVar9;
    local_f0.field_2._8_8_ = plVar7[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar9;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_b0 = &local_a0;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_a0 = *plVar10;
    lStack_98 = plVar7[3];
  }
  else {
    local_a0 = *plVar10;
    local_b0 = (long *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_b0,local_a8 + (long)local_b0);
  std::__cxx11::string::append((char *)&local_f0);
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    pcVar3 = (component->Name)._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar3,pcVar3 + (component->Name)._M_string_length);
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,__s,__s + sVar8);
  }
  std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (component->Group == (cmCPackComponentGroup *)0x0) {
LAB_0024ee73:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_d0._M_p == &local_c0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(cStack_b1,CONCAT25(uStack_b3,CONCAT41(uStack_b7,uStack_b8)));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_bf,local_c0);
    }
    __return_storage_ptr__->_M_string_length = local_c8;
    local_c8 = 0;
    local_c0 = '\0';
    local_d0._M_p = &local_c0;
  }
  else {
    pcVar6 = GetGroupPackage(this,component->Group);
    bVar4 = true;
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_b0,local_a8 + (long)local_b0);
      std::__cxx11::string::append((char *)&local_f0);
      bVar4 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4 == false) {
      bVar2 = this->ResolveDuplicateNames;
      if ((bVar2 == false) &&
         (std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_d0),
         local_90._M_string_length == (pcVar6->Name)._M_string_length)) {
        if (local_90._M_string_length == 0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp(local_90._M_dataplus._M_p,(pcVar6->Name)._M_dataplus._M_p,
                       local_90._M_string_length);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      if ((bVar2 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2)) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (!bVar11 && (bVar2 & 1U) == 0) {
        pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
        std::__cxx11::string::append((char *)local_70);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_d0._M_p);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_40 = *plVar10;
          lStack_38 = plVar7[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar10;
          local_50 = (long *)*plVar7;
        }
        local_48 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
    }
    if (bVar4 == false) goto LAB_0024ee73;
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
LAB_0024eed2:
  if (local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent *component) const
{
  std::string name;
  if (!component) return name;
  if (cmCPackIFWPackage* package = GetComponentPackage(component))
    {
    return package->Name;
    }
  std::string prefix = "CPACK_IFW_COMPONENT_"
    + cmsys::SystemTools::UpperCase(component->Name)
    + "_";
  const char* option = GetOption(prefix + "NAME");
  name = option ? option : component->Name;
  if(component->Group)
    {
    cmCPackIFWPackage* package = GetGroupPackage(component->Group);
    if((componentPackageMethod == ONE_PACKAGE_PER_GROUP)
       || IsOn(prefix + "COMMON"))
      {
      return package->Name;
      }
    bool dot = !ResolveDuplicateNames;
    if(dot && name.substr(0, package->Name.size()) == package->Name)
      {
      dot = false;
      }
    if(dot)
      {
      name = package->Name + "." + name;
      }
    }
  return name;
}